

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

bool __thiscall
slang::ast::ConstraintExprVisitor::checkType(ConstraintExprVisitor *this,Expression *expr)

{
  SourceRange sourceRange;
  bool bVar1;
  Type *this_00;
  SourceLocation in_RSI;
  undefined8 in_RDI;
  Type *in_stack_00000008;
  Diagnostic *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 uVar2;
  DiagCode code;
  
  uVar2 = in_RDI;
  this_00 = not_null<const_slang::ast::Type_*>::operator->
                      ((not_null<const_slang::ast::Type_*> *)0x428656);
  code = SUB84((ulong)uVar2 >> 0x20,0);
  ASTContext::getCompilation((ASTContext *)0x42866b);
  Compilation::languageVersion((Compilation *)0x428673);
  bVar1 = Type::isValidForRand(this_00,(RandMode)((ulong)in_RDI >> 0x20),(LanguageVersion)in_RDI);
  if (!bVar1) {
    sourceRange.startLoc._4_4_ = 0x210008;
    sourceRange.startLoc._0_4_ = in_stack_ffffffffffffffe0;
    sourceRange.endLoc = in_RSI;
    ASTContext::addDiag(*(ASTContext **)((long)in_RSI + 0x28),code,sourceRange);
    not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0x4286d6);
    ast::operator<<(in_stack_00000010,in_stack_00000008);
  }
  return bVar1;
}

Assistant:

bool checkType(const Expression& expr) {
        if (!expr.type->isValidForRand(RandMode::Rand,
                                       context.getCompilation().languageVersion())) {
            context.addDiag(diag::InvalidConstraintExpr, expr.sourceRange) << *expr.type;
            return false;
        }
        return true;
    }